

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::BamStandardIndex::Jump
          (BamStandardIndex *this,BamRegion *region,bool *hasAlignmentsInRegion)

{
  bool bVar1;
  byte *in_RDX;
  long in_RDI;
  BamException *e;
  int64_t offset;
  bool *in_stack_000002d8;
  int64_t *in_stack_000002e0;
  BamRegion *in_stack_000002e8;
  BamStandardIndex *in_stack_000002f0;
  allocator local_79;
  string local_78 [40];
  string *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  BamIndex *in_stack_ffffffffffffffc0;
  
  *in_RDX = 0;
  if ((*(long *)(in_RDI + 8) != 0) &&
     (bVar1 = BamReaderPrivate::IsOpen((BamReaderPrivate *)0x2d00ac), bVar1)) {
    GetOffset(in_stack_000002f0,in_stack_000002e8,in_stack_000002e0,in_stack_000002d8);
    if ((*in_RDX & 1) != 0) {
      bVar1 = BamReaderPrivate::Seek((BamReaderPrivate *)this,(int64_t *)region);
      return bVar1;
    }
    return true;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffc0,"BamStandardIndex::Jump",
             (allocator *)&stack0xffffffffffffffbf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"could not jump: reader is not open",&local_79);
  BamIndex::SetErrorString
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
  return false;
}

Assistant:

bool BamStandardIndex::Jump(const BamRegion& region, bool* hasAlignmentsInRegion)
{

    // clear out flag
    *hasAlignmentsInRegion = false;

    // skip if invalid reader or not open
    if (m_reader == 0 || !m_reader->IsOpen()) {
        SetErrorString("BamStandardIndex::Jump", "could not jump: reader is not open");
        return false;
    }

    // calculate nearest offset to jump to
    int64_t offset;
    try {
        GetOffset(region, offset, hasAlignmentsInRegion);
    } catch (BamException& e) {
        m_errorString = e.what();
        return false;
    }

    // if region has alignments, return success/fail of seeking there
    if (*hasAlignmentsInRegion) return m_reader->Seek(offset);

    // otherwise, simply return true (but hasAlignmentsInRegion flag has been set to false)
    // (this is OK, BamReader will check this flag before trying to load data)
    return true;
}